

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Level.cpp
# Opt level: O3

string * __thiscall
Level::get_level_name_abi_cxx11_(string *__return_storage_ptr__,Level *this,int level_id)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  size_type *psVar5;
  ulong uVar6;
  uint __val;
  uint __len;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  __val = -level_id;
  if (0 < level_id) {
    __val = level_id;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar6;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_00109da5;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_00109da5;
      }
      if (uVar4 < 10000) goto LAB_00109da5;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_00109da5:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(level_id >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)level_id >> 0x1f) + (long)local_50[0]),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10a267);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Level::get_level_name(int level_id) {
    std::string ans="DATA\\"+to_string(level_id);
    return ans;
}